

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

transition_table_type<vending::events::power_off> *
afsm::transitions::
state_transition_table<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::vending_def,unsigned_long>
::transition_table<vending::events::power_off,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  int iVar1;
  
  if ((transition_table<vending::events::power_off,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
       ::_table == '\0') &&
     (iVar1 = __cxa_guard_acquire(&transition_table<vending::events::power_off,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                                   ::_table), iVar1 != 0)) {
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[0].
    super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[0]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::power_off_&&),_afsm::transitions::detail::single_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>,_psst::meta::type_tuple<afsm::def::transition<vending::vending_def::on,_vending::events::power_off,_vending::vending_def::off,_afsm::none,_afsm::none>_>_>_>
         ::_M_invoke;
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[0].
    super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::power_off_&&),_afsm::transitions::detail::single_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>,_psst::meta::type_tuple<afsm::def::transition<vending::vending_def::on,_vending::events::power_off,_vending::vending_def::off,_afsm::none,_afsm::none>_>_>_>
         ::_M_manager;
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[1].
    super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[1]._M_invoker =
         std::
         _Function_handler<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::power_off_&&),_afsm::transitions::detail::no_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_>_>
         ::_M_invoke;
    state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
    ::transition_table<vending::events::power_off,_0UL,_1UL>::_table._M_elems[1].
    super__Function_base._M_manager =
         std::
         _Function_handler<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::power_off_&&),_afsm::transitions::detail::no_transition<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_>_>
         ::_M_manager;
    __cxa_atexit(std::
                 array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>_&,_vending::events::power_off_&&)>,_2UL>
                 ::~array,&state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
                           ::transition_table<vending::events::power_off,_0UL,_1UL>::_table,
                 &__dso_handle);
    __cxa_guard_release(&transition_table<vending::events::power_off,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                         ::_table);
  }
  return &state_transition_table<afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_vending::vending_def,_unsigned_long>
          ::transition_table<vending::events::power_off,_0UL,_1UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }